

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

unordered_flat_map<unsigned_long,_unsigned_long,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
* __thiscall
slang::
TypedBumpAllocator<boost::unordered::unordered_flat_map<unsigned_long,_unsigned_long,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
::emplace<>(TypedBumpAllocator<boost::unordered::unordered_flat_map<unsigned_long,_unsigned_long,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
            *this)

{
  Segment *pSVar1;
  unordered_flat_map<unsigned_long,_unsigned_long,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *puVar2;
  
  pSVar1 = (this->super_BumpAllocator).head;
  puVar2 = (unordered_flat_map<unsigned_long,_unsigned_long,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
            *)((ulong)(pSVar1->current + 7) & 0xfffffffffffffff8);
  if ((unordered_flat_map<unsigned_long,_unsigned_long,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
       *)(this->super_BumpAllocator).endPtr < puVar2 + 1) {
    puVar2 = (unordered_flat_map<unsigned_long,_unsigned_long,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
              *)BumpAllocator::allocateSlow(&this->super_BumpAllocator,0x30,8);
  }
  else {
    pSVar1->current = (byte *)(puVar2 + 1);
  }
  (puVar2->table_).
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_slang::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  .arrays.groups_size_index = 0x3f;
  (puVar2->table_).
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_slang::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  .arrays.groups_size_mask = 1;
  (puVar2->table_).
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_slang::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (puVar2->table_).
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_slang::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (puVar2->table_).
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_slang::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  .size_ctrl.ml = 0;
  (puVar2->table_).
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_slang::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  .size_ctrl.size = 0;
  return puVar2;
}

Assistant:

T* emplace(Args&&... args) {
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }